

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

int tiologopn(tiocxdef *ctx,char *fn)

{
  tiologcls(ctx);
  strcpy(logfname,fn);
  logfp = (osfildef *)fopen(fn,"w");
  G_log_disp.linepos = '\0';
  G_log_disp.linecol = '\0';
  G_log_disp.linebuf[0] = '\0';
  G_log_disp.linecnt = 0;
  G_log_disp.capturing = 0;
  G_log_disp._10256_7_ = 0;
  G_log_disp._10263_4_ = 0;
  G_log_disp.capture_obj = 0xffff;
  G_log_disp.html_quote_level = 0;
  G_log_disp.html_pre_level = 0;
  G_log_disp.html_allow_alt = 0;
  G_log_disp.preview = 0;
  G_log_disp.just_did_nl = 0;
  G_log_disp.use_more_mode = 0;
  G_log_disp.os_line_wrap = 0;
  G_log_disp.html_mode_flag = 0;
  G_log_disp.html_defer_br = 0;
  G_log_disp.html_in_ignore = 0;
  G_log_disp.html_in_title = 0;
  G_log_disp.do_print = do_log_print;
  G_log_disp.html_target = 0;
  G_log_disp.plain_text_target = 1;
  G_log_disp.html_mode = G_std_disp.html_mode;
  return (uint)((FILE *)logfp == (FILE *)0x0);
}

Assistant:

int tiologopn(tiocxdef *ctx, char *fn)
{
    /* if there's an old log file, close it */
    if (tiologcls(ctx))
        return 1;

    /* save the filename for later */
    strcpy(logfname, fn);

    /* open the new file */
    logfp = osfopwt(fn, OSFTLOG);

    /* 
     *   Reset the log file's output formatter state, since we're opening
     *   a new file.  
     */
    out_init_log(&G_log_disp);

    /* 
     *   Set the log file's HTML source mode flag to the same value as is
     *   currently being used in the main display stream, so that it will
     *   interpret source markups the same way that the display stream is
     *   going to.  
     */
    G_log_disp.html_mode = G_std_disp.html_mode;

    /* return 0 on success, non-zero on failure */
    return (logfp == 0);
}